

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinPrimitiveEquals
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  Type TVar1;
  pointer pVVar2;
  bool bVar3;
  anon_union_8_3_4e909c26_for_v aVar4;
  ostream *poVar5;
  RuntimeError *pRVar6;
  undefined1 auVar7 [16];
  string local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  pVVar2 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2 != 0x20) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_1a0,"primitiveEquals takes 2 parameters, got ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    pRVar6 = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    Stack::makeError(pRVar6,&this->stack,loc,&local_1d0);
    __cxa_throw(pRVar6,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  TVar1 = pVVar2->t;
  if (TVar1 == pVVar2[1].t) {
    if (TVar1 == NULL_TYPE) {
      bVar3 = true;
    }
    else if (TVar1 == BOOLEAN) {
      bVar3 = (pVVar2->v).b == pVVar2[1].v.b;
    }
    else if (TVar1 == NUMBER) {
      bVar3 = (bool)(-(pVVar2[1].v.d == (pVVar2->v).d) & 1);
    }
    else {
      if (TVar1 != STRING) {
        if (TVar1 == FUNCTION) {
          pRVar6 = (RuntimeError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ss,"cannot test equality of functions",(allocator<char> *)&local_1d0
                    );
          Stack::makeError(pRVar6,&this->stack,loc,(string *)&ss);
          __cxa_throw(pRVar6,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
        }
        auVar7 = __cxa_allocate_exception(0x38);
        (anonymous_namespace)::type_str_abi_cxx11_
                  (&local_1d0,
                   (_anonymous_namespace_ *)
                   (args->
                   super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                   )._M_impl.super__Vector_impl_data._M_start,auVar7._8_8_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       "primitiveEquals operates on primitive types, got ",&local_1d0);
        Stack::makeError(auVar7._0_8_,&this->stack,loc,(string *)&ss);
        __cxa_throw(auVar7._0_8_,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
      }
      bVar3 = std::operator==((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                               *)((pVVar2->v).h + 1),
                              (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                               *)(pVVar2[1].v.h + 1));
    }
    aVar4._1_7_ = 0;
    aVar4.b = bVar3;
  }
  else {
    aVar4.h = (HeapEntity *)0x0;
  }
  (this->scratch).t = BOOLEAN;
  (this->scratch).v = aVar4;
  return (AST *)0x0;
}

Assistant:

const AST *builtinPrimitiveEquals(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args.size() != 2) {
            std::stringstream ss;
            ss << "primitiveEquals takes 2 parameters, got " << args.size();
            throw makeError(loc, ss.str());
        }
        if (args[0].t != args[1].t) {
            scratch = makeBoolean(false);
            return nullptr;
        }
        bool r;
        switch (args[0].t) {
            case Value::BOOLEAN: r = args[0].v.b == args[1].v.b; break;

            case Value::NUMBER: r = args[0].v.d == args[1].v.d; break;

            case Value::STRING:
                r = static_cast<HeapString *>(args[0].v.h)->value ==
                    static_cast<HeapString *>(args[1].v.h)->value;
                break;

            case Value::NULL_TYPE: r = true; break;

            case Value::FUNCTION: throw makeError(loc, "cannot test equality of functions"); break;

            default:
                throw makeError(loc,
                                "primitiveEquals operates on primitive "
                                "types, got " +
                                    type_str(args[0]));
        }
        scratch = makeBoolean(r);
        return nullptr;
    }